

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_man.cpp
# Opt level: O0

bool __thiscall FScanner::CheckFloat(FScanner *this)

{
  bool bVar1;
  double dVar2;
  char *local_20;
  char *stopper;
  FScanner *this_local;
  
  stopper = (char *)this;
  bVar1 = GetString(this);
  if (bVar1) {
    if (*this->String == '\0') {
      UnGet(this);
      this_local._7_1_ = false;
    }
    else {
      dVar2 = strtod(this->String,&local_20);
      this->Float = dVar2;
      if (*local_20 == '\0') {
        this_local._7_1_ = true;
      }
      else {
        UnGet(this);
        this_local._7_1_ = false;
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool FScanner::CheckFloat ()
{
	char *stopper;

	if (GetString())
	{
		if (String[0] == 0)
		{
			UnGet();
			return false;
		}
	
		Float = strtod (String, &stopper);
		if (*stopper != 0)
		{
			UnGet();
			return false;
		}
		return true;
	}
	else
	{
		return false;
	}
}